

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_cpu.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ALLEGRO_EVENT event;
  _Bool redraw;
  _Bool done;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  int local_80;
  int local_60;
  
  bVar1 = false;
  bVar2 = true;
  uVar4 = al_install_system(0x5020700,atexit);
  if ((uVar4 & 1) == 0) {
    abort_example("Failed to init Allegro.\n");
  }
  al_init_font_addon();
  init_platform_specific();
  lVar5 = al_create_display(0x280,0x1e0);
  if (lVar5 == 0) {
    abort_example("Error creating display.\n");
  }
  uVar4 = al_install_keyboard();
  if ((uVar4 & 1) == 0) {
    abort_example("Error installing keyboard.\n");
  }
  uVar6 = al_create_builtin_font();
  uVar7 = al_create_timer(0x3fb999999999999a);
  uVar8 = al_create_event_queue();
  uVar9 = al_get_keyboard_event_source();
  al_register_event_source(uVar8,uVar9);
  uVar9 = al_get_timer_event_source(uVar7);
  al_register_event_source(uVar8,uVar9);
  uVar9 = al_get_display_event_source(lVar5);
  al_register_event_source(uVar8,uVar9);
  al_start_timer(uVar7);
  al_set_blender(0,1,3);
  while (!bVar1) {
    if ((bVar2) && (uVar4 = al_is_event_queue_empty(uVar8), (uVar4 & 1) != 0)) {
      uVar9 = 0;
      uVar7 = al_map_rgba_f(0);
      al_clear_to_color(uVar7,uVar9);
      uVar9 = 0x3f800000;
      uVar7 = al_map_rgba_f(0x3f800000,0x3f800000,0);
      uVar3 = al_get_cpu_count();
      al_draw_textf(uVar7,uVar9,0x41800000,uVar6,0,"Amount of CPU cores detected: %d.",uVar3);
      uVar9 = 0x3f800000;
      uVar7 = al_map_rgba_f(0,0x3f800000,0x3f800000);
      uVar3 = al_get_ram_size();
      al_draw_textf(uVar7,uVar9,0x41800000,0x42000000,uVar6,0,
                    "Size of random access memory: %d MiB.",uVar3);
      al_flip_display();
      bVar2 = false;
    }
    al_wait_for_event(uVar8);
    if (local_80 == 10) {
      if (local_60 == 0x3b) {
        bVar1 = true;
      }
    }
    else if (local_80 == 0x1e) {
      bVar2 = true;
    }
    else if (local_80 == 0x2a) {
      bVar1 = true;
    }
  }
  al_destroy_font(uVar6);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   al_init_font_addon();
   init_platform_specific();
   

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_create_builtin_font();

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgba_f(0, 0, 0, 1.0));
         al_draw_textf(font, al_map_rgba_f(1, 1, 0, 1.0), 16, 16, 0,
                       "Amount of CPU cores detected: %d.", al_get_cpu_count());
         al_draw_textf(font, al_map_rgba_f(0, 1, 1, 1.0), 16, 32, 0, 
                       "Size of random access memory: %d MiB.", al_get_ram_size());
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               done = true;
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
      }
   }

   al_destroy_font(font);

   return 0;
}